

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CRTC6845.hpp
# Opt level: O2

void __thiscall
Motorola::CRTC::
CRTC6845<PCCompatible::MDA::CRTCOutputter,_(Motorola::CRTC::Personality)0,_(Motorola::CRTC::CursorType)1>
::run_for(CRTC6845<PCCompatible::MDA::CRTCOutputter,_(Motorola::CRTC::Personality)0,_(Motorola::CRTC::CursorType)1>
          *this,Cycles cycles)

{
  ushort uVar1;
  uint uVar2;
  uint8_t uVar3;
  ushort uVar4;
  bool bVar5;
  
LAB_0033f3e4:
  bVar5 = cycles.super_WrappedInt<Cycles>.length_ == 0;
  cycles.super_WrappedInt<Cycles>.length_ =
       (WrappedInt<Cycles>)((long)cycles.super_WrappedInt<Cycles>.length_ + -1);
  if (bVar5) {
    return;
  }
  if (this->character_counter_ == (this->layout_).horizontal.displayed) {
    this->character_is_visible_ = false;
    this->end_of_line_address_ = (this->bus_state_).refresh_address;
  }
  perform_bus_cycle_phase1(this);
  uVar1 = (this->layout_).cursor_address;
  uVar4 = (this->bus_state_).refresh_address + 1 & 0x3fff;
  (this->bus_state_).refresh_address = uVar4;
  (this->bus_state_).cursor = (bool)(uVar4 == uVar1 & this->is_cursor_line_);
  if (this->character_counter_ == (this->layout_).horizontal.total) {
    this->character_counter_ = '\0';
    do_end_of_line(this);
    this->character_is_visible_ = true;
    uVar3 = this->character_counter_;
  }
  else {
    uVar3 = this->character_counter_ + '\x01';
    this->character_counter_ = uVar3;
  }
  if (uVar3 != (this->layout_).horizontal.start_sync) goto LAB_0033f468;
  this->hsync_counter_ = 0;
  goto LAB_0033f473;
LAB_0033f468:
  if (((this->bus_state_).hsync & 1U) != 0) {
LAB_0033f473:
    uVar2 = this->hsync_counter_;
    (this->bus_state_).hsync = uVar2 != (this->layout_).horizontal.sync_width;
    this->hsync_counter_ = uVar2 + 1 & 0xf;
  }
  goto LAB_0033f3e4;
}

Assistant:

void run_for(Cycles cycles) {
			auto cyles_remaining = cycles.as_integral();
			while(cyles_remaining--) {
				// Check for end of visible characters.
				if(character_counter_ == layout_.horizontal.displayed) {
					// TODO: consider skew in character_is_visible_. Or maybe defer until perform_bus_cycle?
					character_is_visible_ = false;
					end_of_line_address_ = bus_state_.refresh_address;
				}

				perform_bus_cycle_phase1();
				bus_state_.refresh_address = (bus_state_.refresh_address + 1) & RefreshMask;

				bus_state_.cursor = is_cursor_line_ &&
					bus_state_.refresh_address == layout_.cursor_address;

				// Check for end-of-line.
				if(character_counter_ == layout_.horizontal.total) {
					character_counter_ = 0;
					do_end_of_line();
					character_is_visible_ = true;
				} else {
					// Increment counter.
					character_counter_++;
				}

				// Check for start of horizontal sync.
				if(character_counter_ == layout_.horizontal.start_sync) {
					hsync_counter_ = 0;
					bus_state_.hsync = true;
				}

				// Check for end of horizontal sync; note that a sync time of zero will result in an immediate
				// cancellation of the plan to perform sync if this is an HD6845S or UM6845R; otherwise zero
				// will end up counting as 16 as it won't be checked until after overflow.
				if(bus_state_.hsync) {
					switch(personality) {
						case Personality::HD6845S:
						case Personality::UM6845R:
							bus_state_.hsync = hsync_counter_ != layout_.horizontal.sync_width;
							hsync_counter_ = (hsync_counter_ + 1) & 15;
						break;
						default:
							hsync_counter_ = (hsync_counter_ + 1) & 15;
							bus_state_.hsync = hsync_counter_ != layout_.horizontal.sync_width;
						break;
					}
				}

				perform_bus_cycle_phase2();
			}
		}